

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprListCompare(ExprList *pA,ExprList *pB,int iTab)

{
  int iVar1;
  Expr *pExprB;
  Expr *pExprA;
  int local_28;
  int res;
  int i;
  int iTab_local;
  ExprList *pB_local;
  ExprList *pA_local;
  
  if ((pA == (ExprList *)0x0) && (pB == (ExprList *)0x0)) {
    pA_local._4_4_ = 0;
  }
  else if ((pA == (ExprList *)0x0) || (pB == (ExprList *)0x0)) {
    pA_local._4_4_ = 1;
  }
  else if (pA->nExpr == pB->nExpr) {
    for (local_28 = 0; local_28 < pA->nExpr; local_28 = local_28 + 1) {
      if (pA->a[local_28].fg.sortFlags != pB->a[local_28].fg.sortFlags) {
        return 1;
      }
      iVar1 = sqlite3ExprCompare((Parse *)0x0,pA->a[local_28].pExpr,pB->a[local_28].pExpr,iTab);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    pA_local._4_4_ = 0;
  }
  else {
    pA_local._4_4_ = 1;
  }
  return pA_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprListCompare(const ExprList *pA, const ExprList *pB, int iTab){
  int i;
  if( pA==0 && pB==0 ) return 0;
  if( pA==0 || pB==0 ) return 1;
  if( pA->nExpr!=pB->nExpr ) return 1;
  for(i=0; i<pA->nExpr; i++){
    int res;
    Expr *pExprA = pA->a[i].pExpr;
    Expr *pExprB = pB->a[i].pExpr;
    if( pA->a[i].fg.sortFlags!=pB->a[i].fg.sortFlags ) return 1;
    if( (res = sqlite3ExprCompare(0, pExprA, pExprB, iTab)) ) return res;
  }
  return 0;
}